

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O3

int AF_A_SpawnBishop(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  AActor *other;
  PClass *pPVar3;
  PClass *pPVar4;
  PClassActor *type;
  AActor *mobj;
  long *plVar5;
  char *__assertion;
  bool bVar6;
  FName local_4c;
  DVector3 local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005e148f;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    plVar5 = (long *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (plVar5 == (long *)0x0) {
LAB_005e12f6:
        plVar5 = (long *)0x0;
      }
      else {
        pPVar4 = (PClass *)plVar5[1];
        if (pPVar4 == (PClass *)0x0) {
          pPVar4 = (PClass *)(**(code **)*plVar5)(plVar5);
          plVar5[1] = (long)pPVar4;
        }
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar3 && bVar6) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar6 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar3) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar6) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005e148f;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005e13b6;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005e147f;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar4 = (PClass *)puVar2[1];
            if (pPVar4 == (PClass *)0x0) {
              pPVar4 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar4;
            }
            bVar6 = pPVar4 != (PClass *)0x0;
            if (pPVar4 != pPVar3 && bVar6) {
              do {
                pPVar4 = pPVar4->ParentClass;
                bVar6 = pPVar4 != (PClass *)0x0;
                if (pPVar4 == pPVar3) break;
              } while (pPVar4 != (PClass *)0x0);
            }
            if (!bVar6) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005e148f;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005e147f;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005e13b6:
        local_4c.Index = FName::NameManager::FindName(&FName::NameData,"Bishop",false);
        local_48.X = (double)plVar5[9];
        local_48.Y = (double)plVar5[10];
        local_48.Z = (double)plVar5[0xb];
        type = ClassForSpawn(&local_4c);
        mobj = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
        if (mobj != (AActor *)0x0) {
          bVar6 = P_TestMobjLocation(mobj);
          if (bVar6) {
            other = (AActor *)plVar5[0x3b];
            if (other != (AActor *)0x0) {
              if (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
                AActor::CopyFriendliness(mobj,other,true,true);
                (mobj->master).field_0 =
                     *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(plVar5 + 0x3b);
              }
              else {
                plVar5[0x3b] = 0;
              }
            }
          }
          else {
            AActor::ClearCounters(mobj);
            (*(mobj->super_DThinker).super_DObject._vptr_DObject[4])(mobj);
          }
        }
        (**(code **)(*plVar5 + 0x20))(plVar5);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005e148f;
    }
    if (plVar5 == (long *)0x0) goto LAB_005e12f6;
  }
LAB_005e147f:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005e148f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                ,0x352,"int AF_A_SpawnBishop(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SpawnBishop)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	mo = Spawn("Bishop", self->Pos(), ALLOW_REPLACE);
	if (mo)
	{
		if (!P_TestMobjLocation(mo))
		{
			mo->ClearCounters();
			mo->Destroy ();
		}
		else if (self->target != NULL)
		{ // [RH] Make the new bishops inherit the Heriarch's target
			mo->CopyFriendliness (self->target, true);
			mo->master = self->target;
		}
	}
	self->Destroy ();
	return 0;
}